

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

FileLoc * __thiscall pbrt::ParameterDictionary::loc(ParameterDictionary *this,string *name)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  pointer __s2;
  size_t __n;
  long lVar3;
  int iVar4;
  long lVar5;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar6;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar6 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar6 = paVar1;
  }
  if (sVar2 != 0) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    lVar5 = 0;
    do {
      lVar3 = *(long *)((long)paVar6 + lVar5);
      if ((*(size_t *)(lVar3 + 0x28) == __n) &&
         ((__n == 0 || (iVar4 = bcmp(*(void **)(lVar3 + 0x20),__s2,__n), iVar4 == 0)))) {
        return (FileLoc *)(lVar3 + 0x40);
      }
      lVar5 = lVar5 + 8;
    } while (sVar2 << 3 != lVar5);
  }
  return (FileLoc *)0x0;
}

Assistant:

std::string ParameterDictionary::GetTexture(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != "texture")
            continue;

        if (p->strings.empty())
            ErrorExit(&p->loc, "No string values provided for parameter \"%s\".", name);
        if (p->strings.size() > 1)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);
        p->lookedUp = true;
        return p->strings[0];
    }

    return "";
}